

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

obj * getobj(char *let,char *word,obj **ostack)

{
  char cVar1;
  ushort uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  obj_use_status oVar6;
  int iVar7;
  char *pcVar8;
  undefined4 extraout_var;
  ulong uVar9;
  undefined4 extraout_var_00;
  obj *poVar10;
  char *pcVar11;
  long *out_cnt;
  char *pcVar12;
  byte bVar13;
  ulong uVar14;
  int *count;
  obj **otmp;
  char *__s;
  bool bVar15;
  int cnt;
  long ctmp;
  char buf [256];
  char altlets [256];
  char qbuf [128];
  char lets [256];
  int local_3ec;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  ulong local_3d0;
  long local_3c8;
  obj **local_3c0;
  char local_3b8;
  char local_3b7 [255];
  char local_2b8 [256];
  char local_1b8 [128];
  char local_138 [264];
  
  uVar14 = (ulong)(*let == '\x13');
  pcVar8 = (char *)(ulong)(let[uVar14] == '\x14');
  cVar1 = let[(long)pcVar8 + uVar14];
  cVar4 = let[(ulong)(cVar1 == '\x15') + (long)pcVar8 + uVar14];
  __s = let + (ulong)(cVar4 == '\x16') + (ulong)(cVar1 == '\x15') + (long)pcVar8 + uVar14;
  local_3e8 = word;
  local_3c0 = ostack;
  if ((let[uVar14] == '\x14') && (iVar5 = strcmp(word,"read"), iVar5 == 0)) {
    pcVar8 = (char *)0x0;
  }
  bVar15 = true;
  if ((*__s == '\x02') && (iVar5 = strcmp(local_3e8,"throw"), iVar5 == 0)) {
    bVar15 = ((youmonst.data)->mflags2 & 0x8000000) == 0;
  }
  local_3d0 = (ulong)(cVar4 == '\x16') ^ 0x2d;
  pcVar12 = &local_3b8;
  if (cVar1 == '\x15') {
    pcVar12 = local_3b7;
    local_3b8 = (char)local_3d0;
  }
  if ((&local_3b8 < pcVar12) && (pcVar12[-1] == (char)local_3d0)) {
    *pcVar12 = ' ';
    pcVar12 = pcVar12 + 1;
  }
  if (invent == (obj *)0x0) {
    pcVar11 = "";
    iVar5 = 0;
    local_3d8 = local_2b8;
  }
  else {
    local_3d8 = local_2b8;
    cVar4 = '\0';
    iVar5 = 0;
    poVar10 = invent;
    local_3e0 = pcVar8;
    do {
      if (((*__s == '\0') || (pcVar8 = strchr(__s,(int)poVar10->oclass), pcVar8 != (char *)0x0)) ||
         ((!bVar15 && (poVar10->otyp == 0x214)))) {
        pcVar12[iVar5] = poVar10->invlet;
        oVar6 = object_selection_checks(poVar10,local_3e8);
        if (oVar6 - ALREADY_IN_USE < 2) {
          cVar4 = cVar4 + '\x01';
        }
        else if (oVar6 != UNSUITABLE_USE) {
          if (oVar6 == CURRENTLY_NOT_USABLE) {
            uVar9 = CONCAT71((int7)(CONCAT44(extraout_var,oVar6) >> 8),poVar10->invlet);
            *local_3d8 = poVar10->invlet;
            local_3d8 = local_3d8 + 1;
            goto LAB_001af063;
          }
          iVar5 = iVar5 + 1;
        }
      }
      else {
        iVar7 = strcmp(local_3e8,"read");
        if (iVar7 == 0) {
          uVar2 = poVar10->otyp;
          uVar9 = (ulong)uVar2;
          if (uVar2 < 0xf5) {
            if (((uVar2 != 0xc) && (uVar2 != 0x7b)) && (uVar2 != 0xe4)) goto LAB_001af0e8;
          }
          else if ((0x34 < uVar2 - 0xf5) ||
                  ((0x10300000000005U >> ((ulong)(uVar2 - 0xf5) & 0x3f) & 1) == 0)) {
LAB_001af0e8:
            if (poVar10->oartifact != '#') {
              if (obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr != (char *)0x0) {
                iVar7 = strncmp(obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr,"runed",5);
                uVar9 = CONCAT44(extraout_var_00,iVar7);
                if (iVar7 == 0) goto LAB_001af063;
              }
              goto LAB_001af0c4;
            }
          }
LAB_001af063:
          local_3e0 = (char *)CONCAT71((int7)(uVar9 >> 8),1);
        }
      }
LAB_001af0c4:
      poVar10 = poVar10->nobj;
    } while (poVar10 != (obj *)0x0);
    pcVar11 = "else ";
    pcVar8 = local_3e0;
    if (cVar4 == '\0') {
      pcVar11 = "";
    }
  }
  uVar9 = local_3d0;
  pcVar12[iVar5] = '\0';
  if (((iVar5 == 0) && (&local_3b8 < pcVar12)) && (pcVar12[-1] == ' ')) {
    pcVar12 = pcVar12 + -1;
    *pcVar12 = '\0';
  }
  local_3e0 = pcVar11;
  strcpy(local_138,pcVar12);
  if (5 < iVar5) {
    compactify(pcVar12);
  }
  *local_3d8 = '\0';
  if (((cVar1 != '\x15') && (iVar5 == 0)) && ((char)pcVar8 == '\0')) {
    pline("You don\'t have anything %sto %s.",local_3e0,local_3e8);
    return (obj *)0x0;
  }
  local_3d8 = (char *)CONCAT71(local_3d8._1_7_,'$');
  local_3e0 = pcVar8;
  bVar15 = false;
LAB_001af20a:
  local_3ec = 0;
  bVar13 = (byte)uVar14;
  if ((byte)uVar14 == 2) {
    bVar13 = 1;
  }
  check_tutorial_message(0x10b);
  if (local_3b8 == '\0') {
    sprintf(local_1b8,"What do you want to %s? [*]",local_3e8);
  }
  else {
    sprintf(local_1b8,"What do you want to %s? [%s or ?*]",local_3e8,&local_3b8);
  }
  count = &local_3ec;
  if (bVar13 == 0) {
    count = (int *)0x0;
  }
  cVar4 = query_key(local_1b8,count);
  uVar14 = (ulong)(uint)bVar13;
  if (local_3ec != -1) {
    uVar14 = 2;
  }
  bVar3 = bVar15;
  if (local_3ec == 0) {
    bVar3 = true;
  }
  if (bVar13 != 1) {
    uVar14 = (ulong)(uint)bVar13;
    bVar3 = bVar15;
  }
  if (local_3ec == -1) {
    local_3ec = 0;
  }
  pcVar8 = strchr(" \r\n\x1b",(int)cVar4);
  if (pcVar8 != (char *)0x0) {
    if (flags.verbose == '\0') {
      return (obj *)0x0;
    }
    pcVar8 = "Never mind.";
LAB_001af4f4:
    pline(pcVar8);
    return (obj *)0x0;
  }
  if (cVar4 == (char)uVar9) {
    if (cVar1 != '\x15') {
      return (obj *)0x0;
    }
    return &zeroobj;
  }
  if (cVar4 == (char)local_3d8) {
    if ((local_3ec == 0) && (bVar3)) {
      return (obj *)0x0;
    }
    if (local_3ec < 0) {
      pcVar8 = "The LRS would be very interested to know you have that much.";
      goto LAB_001af4f4;
    }
  }
  if ((cVar4 == '?') || (cVar4 == '*')) goto LAB_001af320;
  goto LAB_001af3fd;
LAB_001af320:
  pcVar8 = (char *)0x0;
  if (cVar4 == '?') {
    pcVar8 = local_138;
  }
  pcVar12 = pcVar8;
  if (local_2b8[0] != '\0') {
    pcVar12 = local_2b8;
  }
  if (local_138[0] != '\0') {
    pcVar12 = pcVar8;
  }
  local_3c8 = 0;
  if (cVar4 != '?') {
    pcVar12 = pcVar8;
  }
  out_cnt = (long *)0x0;
  if ((char)uVar14 != '\0') {
    out_cnt = &local_3c8;
  }
  cVar4 = display_pickinv(pcVar12,'\x01',out_cnt);
  if (cVar4 == '\0') {
    iVar5 = 7;
  }
  else {
    if (-1 < local_3c8 && (char)uVar14 != '\0') {
      local_3ec = (int)local_3c8;
      if (local_3ec == 0) {
        bVar3 = true;
      }
      uVar14 = 2;
    }
    iVar5 = 0;
    if ((cVar4 == '\x1b') && (iVar5 = 1, flags.verbose != '\0')) {
      pline("Never mind.");
    }
  }
  bVar15 = bVar3;
  if (iVar5 != 7) {
    if (iVar5 != 0) {
      return (obj *)0x0;
    }
LAB_001af3fd:
    bVar15 = bVar3;
    if (((char)uVar14 == '\x02') && (iVar5 = strcmp(local_3e8,"throw"), iVar5 == 0)) {
      if (cVar4 != (char)local_3d8) {
        uVar14 = 1;
      }
      if ((local_3ec == 0) && (bVar3)) {
        return (obj *)0x0;
      }
      if (1 < local_3ec) {
        pline("You can only throw one item at a time.");
        goto LAB_001af20a;
      }
    }
    iVar5 = local_3ec;
    iflags.botl = '\x01';
    otmp = &invent;
    do {
      otmp = &((obj *)otmp)->nobj->nobj;
      if ((obj *)otmp == (obj *)0x0) {
        pline("You don\'t have that object.");
        uVar9 = local_3d0;
        goto LAB_001af20a;
      }
    } while (((obj *)otmp)->invlet != cVar4);
    if ((-1 < local_3ec) && (iVar7 = ((obj *)otmp)->quan, local_3ec <= iVar7)) {
      if (((char)local_3e0 == '\0') &&
         (pcVar8 = strchr(__s,(int)((obj *)otmp)->oclass), pcVar8 == (char *)0x0)) {
        silly_thing(local_3e8,(obj *)otmp);
      }
      else {
        if ((char)uVar14 != '\x02') {
          return (obj *)otmp;
        }
        if (iVar5 != 0) {
          if (iVar5 == iVar7) {
            return (obj *)otmp;
          }
          if ((((obj *)otmp)->otyp == 0x210) && ((((obj *)otmp)->field_0x4a & 1) != 0)) {
            ((obj *)otmp)->corpsenm = iVar5;
            return (obj *)otmp;
          }
          iVar5 = welded((obj *)otmp);
          if (iVar5 == 0) {
            if (local_3c0 != (obj **)0x0) {
              *local_3c0 = (obj *)otmp;
            }
            poVar10 = splitobj((obj *)otmp,(long)local_3ec);
            return poVar10;
          }
          return (obj *)otmp;
        }
      }
      return (obj *)0x0;
    }
    pline("You don\'t have that many!  You have only %ld.",(ulong)(uint)((obj *)otmp)->quan);
    uVar9 = local_3d0;
  }
  goto LAB_001af20a;
}

Assistant:

struct obj *getobj(const char *let, const char *word, struct obj **ostack)
{
	struct obj *otmp;
	char ilet;
	char buf[BUFSZ], qbuf[QBUFSZ];
	char lets[BUFSZ], altlets[BUFSZ], *ap;
	int foo = 0;
	char *bp = buf;
	xchar allowcnt = 0;	/* 0, 1 or 2 */
	boolean allowall = FALSE;
	boolean allownone = FALSE;
	char nonechar = '-';
	boolean useboulder = FALSE;
	xchar foox = 0;
	int cnt;
	boolean prezero = FALSE;

	if (*let == ALLOW_COUNT) let++, allowcnt = 1;
	if (*let == ALL_CLASSES) let++, allowall = TRUE;
	if (*let == ALLOW_NONE) let++, allownone = TRUE;
	if (*let == NONE_ON_COMMA) let++, nonechar = ',';
	/* "ugly check" for reading fortune cookies, part 1 */
	/* The normal 'ugly check' keeps the object on the inventory list.
	 * We don't want to do that for shirts/cookies, so the check for
	 * them is handled a bit differently (and also requires that we set
	 * allowall in the caller)
	 */
	if (allowall && !strcmp(word, "read")) allowall = FALSE;

	/* another ugly check: show boulders (not statues) */
	if (*let == WEAPON_CLASS &&
	   !strcmp(word, "throw") && throws_rocks(youmonst.data))
	    useboulder = TRUE;

	if (allownone) *bp++ = nonechar;
	if (bp > buf && bp[-1] == nonechar) *bp++ = ' ';
	ap = altlets;

	ilet = 'a';
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!*let || strchr(let, otmp->oclass)
		|| (useboulder && otmp->otyp == BOULDER)) {
		bp[foo++] = otmp->invlet;
		
		switch (object_selection_checks(otmp, word)) {
		    case ALREADY_IN_USE: /* eg: wield the weapon in your hands */
		    case ARMOR_TAKEOFF_BLOCKED:
			foo--;
			foox++;
			break;
			
		    case UNSUITABLE_USE: /* eg: putting on a tool */
			foo--;
			break;
		    
		    case CURRENTLY_NOT_USABLE:
			foo--;
			allowall = TRUE;
			*ap++ = otmp->invlet;
			break;
			
		    default: break;
		}

	    } else {

		/* "ugly check" for reading fortune cookies, part 2 */
		if (!strcmp(word, "read") &&
		    (otmp->otyp == FORTUNE_COOKIE ||
		     otmp->otyp == T_SHIRT ||
		     otmp->otyp == TIN ||
		     otmp->otyp == CAN_OF_GREASE ||
		     otmp->otyp == CANDY_BAR ||
		     otmp->otyp == CREDIT_CARD ||
		     otmp->otyp == MAGIC_MARKER ||
		     otmp->otyp == COIN_CLASS ||
		     otmp->oartifact == ART_ORB_OF_FATE ||
		     (OBJ_DESCR(objects[otmp->otyp]) &&
		      !strncmp(OBJ_DESCR(objects[otmp->otyp]), "runed", 5))))
			allowall = TRUE;
	    }

	    if (ilet == 'z') ilet = 'A'; else ilet++;
	}
	bp[foo] = 0;
	if (foo == 0 && bp > buf && bp[-1] == ' ') *--bp = 0;
	strcpy(lets, bp);	/* necessary since we destroy buf */
	if (foo > 5)			/* compactify string */
		compactify(bp);
	*ap = '\0';

	if (!foo && !allowall && !allownone) {
		pline("You don't have anything %sto %s.",
			foox ? "else " : "", word);
		return NULL;
	}
	for (;;) {
		cnt = 0;
		if (allowcnt == 2)
		    allowcnt = 1;  /* abort previous count */
		check_tutorial_message(QT_T_CHOOSEITEM);
		if (!buf[0]) {
			sprintf(qbuf, "What do you want to %s? [*]", word);
		} else {
			sprintf(qbuf, "What do you want to %s? [%s or ?*]",
				word, buf);
		}
		ilet = query_key(qbuf, allowcnt ? &cnt : NULL);
		if (allowcnt == 1 && cnt != -1) {
		    allowcnt = 2; /* signal presence of cnt */
		    if (cnt == 0)
			prezero = TRUE; /* cnt was explicitly set to 0 */
		}
		if (cnt == -1)
		    cnt = 0;
		
		if (strchr(quitchars,ilet)) {
		    if (flags.verbose)
			pline("Never mind.");
		    return NULL;
		}
		if (ilet == nonechar) {
			return allownone ? &zeroobj : NULL;
		}
		if (ilet == def_oc_syms[COIN_CLASS]) {
			if (cnt == 0 && prezero) return NULL;
			/* Historic note: early Nethack had a bug which was
			 * first reported for Larn, where trying to drop 2^32-n
			 * gold pieces was allowed, and did interesting things
			 * to your money supply.  The LRS is the tax bureau
			 * from Larn.
			 */
			if (cnt < 0) {
	pline("The LRS would be very interested to know you have that much.");
				return NULL;
			}
		}
		if (ilet == '?' || ilet == '*') {
		    char *allowed_choices = (ilet == '?') ? lets : NULL;
		    long ctmp = 0;

		    if (ilet == '?' && !*lets && *altlets)
			allowed_choices = altlets;
		    ilet = display_pickinv(allowed_choices, TRUE,
					   allowcnt ? &ctmp : NULL);
		    if (!ilet) continue;
		    if (allowcnt && ctmp >= 0) {
			cnt = ctmp;
			if (!cnt) prezero = TRUE;
			allowcnt = 2;
		    }
		    if (ilet == '\033') {
			if (flags.verbose)
			    pline("Never mind.");
			return NULL;
		    }
		    /* they typed a letter (not a space) at the prompt */
		}
		if (allowcnt == 2 && !strcmp(word,"throw")) {
		    /* permit counts for throwing gold, but don't accept
		     * counts for other things since the throw code will
		     * split off a single item anyway */
		    if (ilet != def_oc_syms[COIN_CLASS])
			allowcnt = 1;
		    if (cnt == 0 && prezero) return NULL;
		    if (cnt > 1) {
			pline("You can only throw one item at a time.");
			continue;
		    }
		}
		iflags.botl = 1; /* May have changed the amount of money */

		for (otmp = invent; otmp; otmp = otmp->nobj)
			if (otmp->invlet == ilet) break;
		if (!otmp) {
			pline("You don't have that object.");
			continue;
		} else if (cnt < 0 || otmp->quan < cnt) {
			pline("You don't have that many!  You have only %ld.",
			    otmp->quan);
			continue;
		}
		break;
	}
	if (!allowall && let && !strchr(let,otmp->oclass)) {
		silly_thing(word, otmp);
		return NULL;
	}
	if (allowcnt == 2) {	/* cnt given */
	    if (cnt == 0) return NULL;
	    if (cnt != otmp->quan) {
		/* don't split a stack of cursed loadstones */
		if (otmp->otyp == LOADSTONE && otmp->cursed) {
		    /* kludge for canletgo()'s can't-drop-this message */
		    otmp->corpsenm = (int) cnt;
		} else if (welded(otmp)) {
		    /* don't split a stack of wielded, cursed weapons */
		} else {
		    if (ostack) *ostack = otmp;
		    otmp = splitobj(otmp, cnt);
		}
	    }
	}
	return otmp;
}